

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O3

Pdr_Set_t * Pdr_SetCreateSubset(Pdr_Set_t *pSet,int *pLits,int nLits)

{
  long lVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  int iVar6;
  Pdr_Set_t *pPVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar22;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  
  if (-1 < nLits) {
    uVar2 = pSet->nLits;
    if (nLits <= (int)uVar2) {
      iVar22 = pSet->nTotal;
      iVar6 = (nLits - uVar2) + iVar22;
      pPVar7 = (Pdr_Set_t *)malloc((long)iVar6 * 4 + 0x18);
      pPVar7->nLits = nLits;
      pPVar7->nTotal = iVar6;
      pPVar7->nRefs = 1;
      pPVar7->Sign = 0;
      if (nLits == 0) {
        uVar14 = 0;
      }
      else {
        uVar14 = (ulong)(uint)nLits;
        uVar8 = 0;
        uVar9 = 0;
        do {
          uVar13 = pLits[uVar9];
          if ((int)uVar13 < 0) {
            __assert_fail("pLits[i] >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                          ,0x90,"Pdr_Set_t *Pdr_SetCreateSubset(Pdr_Set_t *, int *, int)");
          }
          *(uint *)(&pPVar7->field_0x14 + uVar9 * 4) = uVar13;
          uVar9 = uVar9 + 1;
          uVar8 = uVar8 | 1L << uVar13 % 0x3f;
          pPVar7->Sign = uVar8;
        } while (uVar14 != uVar9);
        if (1 < nLits) {
          uVar8 = 0;
          do {
            uVar12 = uVar8 & 0xffffffff;
            uVar9 = uVar8;
            do {
              lVar11 = uVar9 * 4;
              uVar9 = uVar9 + 1;
              uVar5 = uVar9 & 0xffffffff;
              if (*(int *)(&pPVar7->field_0x14 + (long)(int)uVar12 * 4) <=
                  *(int *)((long)&pPVar7[1].Sign + lVar11)) {
                uVar5 = uVar12;
              }
              uVar12 = uVar5;
            } while (uVar14 - 1 != uVar9);
            uVar3 = *(undefined4 *)(&pPVar7->field_0x14 + uVar8 * 4);
            *(undefined4 *)(&pPVar7->field_0x14 + uVar8 * 4) =
                 *(undefined4 *)(&pPVar7->field_0x14 + (long)(int)uVar12 * 4);
            uVar8 = uVar8 + 1;
            *(undefined4 *)(&pPVar7->field_0x14 + (long)(int)uVar12 * 4) = uVar3;
          } while (uVar8 != nLits - 1);
        }
      }
      uVar13 = (uint)uVar14;
      if ((int)uVar2 < iVar22) {
        memcpy(&pPVar7->field_0x14 + uVar14 * 4,&pSet->field_0x14 + (long)(int)uVar2 * 4,
               (ulong)(~uVar2 + iVar22) * 4 + 4);
        lVar10 = (long)iVar22 - (long)(int)uVar2;
        lVar11 = lVar10 + -1;
        auVar16._8_4_ = (int)lVar11;
        auVar16._0_8_ = lVar11;
        auVar16._12_4_ = (int)((ulong)lVar11 >> 0x20);
        lVar11 = 2;
        auVar19._8_4_ = 0xffffffff;
        auVar19._0_8_ = 0xffffffffffffffff;
        auVar19._12_4_ = 0xffffffff;
        auVar21 = ZEXT416(uVar13);
        do {
          auVar15 = auVar21;
          auVar21._0_8_ = auVar15._0_8_ + 1;
          auVar21._8_8_ = auVar15._8_8_ - auVar19._8_8_;
          lVar1 = (lVar10 + 1U & 0xfffffffffffffffe) + lVar11;
          lVar11 = lVar11 + -2;
        } while (lVar1 != 4);
        lVar11 = -lVar11;
        auVar18._8_4_ = (int)lVar11;
        auVar18._0_8_ = lVar11;
        auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar16 = auVar16 ^ _DAT_0093d220;
        auVar19 = (auVar18 | _DAT_0093d210) ^ _DAT_0093d220;
        iVar23 = -(uint)(auVar16._0_4_ < auVar19._0_4_);
        iVar24 = -(uint)(auVar16._4_4_ < auVar19._4_4_);
        iVar25 = -(uint)(auVar16._8_4_ < auVar19._8_4_);
        iVar26 = -(uint)(auVar16._12_4_ < auVar19._12_4_);
        iVar22 = -(uint)(auVar19._4_4_ == auVar16._4_4_);
        iVar6 = -(uint)(auVar19._12_4_ == auVar16._12_4_);
        auVar17._4_4_ = iVar22;
        auVar17._0_4_ = iVar22;
        auVar17._8_4_ = iVar6;
        auVar17._12_4_ = iVar6;
        auVar4._4_4_ = iVar23;
        auVar4._0_4_ = iVar23;
        auVar4._8_4_ = iVar25;
        auVar4._12_4_ = iVar25;
        auVar20._4_4_ = iVar24;
        auVar20._0_4_ = iVar24;
        auVar20._8_4_ = iVar26;
        auVar20._12_4_ = iVar26;
        auVar20 = auVar20 | auVar17 & auVar4;
        auVar21 = ~auVar20 & auVar21 | auVar15 & auVar20;
        uVar13 = auVar21._8_4_ + auVar21._0_4_;
      }
      if (uVar13 != pPVar7->nTotal) {
        __assert_fail("k == p->nTotal",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                      ,0x97,"Pdr_Set_t *Pdr_SetCreateSubset(Pdr_Set_t *, int *, int)");
      }
      return pPVar7;
    }
  }
  __assert_fail("nLits >= 0 && nLits <= pSet->nLits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                ,0x88,"Pdr_Set_t *Pdr_SetCreateSubset(Pdr_Set_t *, int *, int)");
}

Assistant:

Pdr_Set_t * Pdr_SetCreateSubset( Pdr_Set_t * pSet, int * pLits, int nLits )
{
    Pdr_Set_t * p;
    int i, k = 0;
    assert( nLits >= 0 && nLits <= pSet->nLits );
    p = (Pdr_Set_t *)ABC_ALLOC( char, sizeof(Pdr_Set_t) + (nLits + pSet->nTotal - pSet->nLits) * sizeof(int) );
    p->nLits  = nLits;
    p->nTotal = nLits + pSet->nTotal - pSet->nLits;
    p->nRefs  = 1;
    p->Sign   = 0;
    for ( i = 0; i < nLits; i++ )
    {
        assert( pLits[i] >= 0 );
        p->Lits[k++] = pLits[i];
        p->Sign   |= ((word)1 << (pLits[i] % 63));
    }
    Vec_IntSelectSort( p->Lits, p->nLits );
    for ( i = pSet->nLits; i < pSet->nTotal; i++ )
        p->Lits[k++] = pSet->Lits[i];
    assert( k == p->nTotal );
    return p;
}